

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain_struct
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  bool bVar1;
  uint32_t uVar2;
  TypedID<(spirv_cross::Types)1> id;
  SPIRType *type_00;
  size_t sVar3;
  TypedID<(spirv_cross::Types)1> *pTVar4;
  SPIRType *pSVar5;
  uint *puVar6;
  SPIRType *member_type;
  uint local_120;
  uint32_t offset;
  uint32_t i;
  SmallVector<unsigned_int,_8UL> subcomposite_chain;
  SPIRAccessChain subchain;
  uint32_t member_count;
  SPIRType *type;
  SmallVector<unsigned_int,_8UL> *composite_chain_local;
  uint32_t value_local;
  SPIRAccessChain *chain_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  sVar3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                    (&(type_00->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  subchain.implied_read_expressions.stack_storage.aligned_char._28_4_ = SUB84(sVar3,0);
  SPIRAccessChain::SPIRAccessChain
            ((SPIRAccessChain *)(subcomposite_chain.stack_storage.aligned_char + 0x18),chain);
  SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)&i,composite_chain);
  offset = 0;
  SmallVector<unsigned_int,_8UL>::push_back((SmallVector<unsigned_int,_8UL> *)&i,&offset);
  for (local_120 = 0;
      local_120 < (uint)subchain.implied_read_expressions.stack_storage.aligned_char._28_4_;
      local_120 = local_120 + 1) {
    uVar2 = Compiler::type_struct_member_offset((Compiler *)this,type_00,local_120);
    subchain._80_4_ = chain->static_index + uVar2;
    pTVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       (&(type_00->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                        (ulong)local_120);
    subchain.super_IVariant._vptr_IVariant._4_4_ = pTVar4->id;
    subchain.static_index = 0;
    subchain.loaded_from.id = 0;
    subchain.matrix_stride._0_1_ = 0;
    uVar2 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)((long)&subchain.super_IVariant._vptr_IVariant + 4));
    pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    if (1 < pSVar5->columns) {
      subchain.static_index =
           Compiler::type_struct_member_matrix_stride((Compiler *)this,type_00,local_120);
      id = TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
      subchain.matrix_stride._0_1_ =
           Compiler::has_member_decoration
                     ((Compiler *)this,(TypeID)id.id,local_120,DecorationRowMajor);
    }
    bVar1 = VectorView<unsigned_int>::empty(&(pSVar5->array).super_VectorView<unsigned_int>);
    if (!bVar1) {
      subchain.loaded_from.id =
           Compiler::type_struct_member_array_stride((Compiler *)this,type_00,local_120);
    }
    puVar6 = VectorView<unsigned_int>::back((VectorView<unsigned_int> *)&i);
    *puVar6 = local_120;
    write_access_chain(this,(SPIRAccessChain *)
                            (subcomposite_chain.stack_storage.aligned_char + 0x18),value,
                       (SmallVector<unsigned_int,_8UL> *)&i);
  }
  SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)&i);
  SPIRAccessChain::~SPIRAccessChain
            ((SPIRAccessChain *)(subcomposite_chain.stack_storage.aligned_char + 0x18));
  return;
}

Assistant:

void CompilerHLSL::write_access_chain_struct(const SPIRAccessChain &chain, uint32_t value,
                                             const SmallVector<uint32_t> &composite_chain)
{
	auto &type = get<SPIRType>(chain.basetype);
	uint32_t member_count = uint32_t(type.member_types.size());
	auto subchain = chain;

	auto subcomposite_chain = composite_chain;
	subcomposite_chain.push_back(0);

	for (uint32_t i = 0; i < member_count; i++)
	{
		uint32_t offset = type_struct_member_offset(type, i);
		subchain.static_index = chain.static_index + offset;
		subchain.basetype = type.member_types[i];

		subchain.matrix_stride = 0;
		subchain.array_stride = 0;
		subchain.row_major_matrix = false;

		auto &member_type = get<SPIRType>(subchain.basetype);
		if (member_type.columns > 1)
		{
			subchain.matrix_stride = type_struct_member_matrix_stride(type, i);
			subchain.row_major_matrix = has_member_decoration(type.self, i, DecorationRowMajor);
		}

		if (!member_type.array.empty())
			subchain.array_stride = type_struct_member_array_stride(type, i);

		subcomposite_chain.back() = i;
		write_access_chain(subchain, value, subcomposite_chain);
	}
}